

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast_expression.cpp
# Opt level: O3

void __thiscall
duckdb::CastExpression::CastExpression
          (CastExpression *this,LogicalType *target,
          unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
          *child,bool try_cast_p)

{
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ParsedExpression_*,_false> _Var2;
  
  (this->super_ParsedExpression).super_BaseExpression.type = OPERATOR_CAST;
  (this->super_ParsedExpression).super_BaseExpression.expression_class = CAST;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_dataplus._M_p =
       (pointer)&(this->super_ParsedExpression).super_BaseExpression.alias.field_2;
  (this->super_ParsedExpression).super_BaseExpression.alias._M_string_length = 0;
  (this->super_ParsedExpression).super_BaseExpression.alias.field_2._M_local_buf[0] = '\0';
  (this->super_ParsedExpression).super_BaseExpression.query_location.index = 0xffffffffffffffff;
  (this->super_ParsedExpression).super_BaseExpression._vptr_BaseExpression =
       (_func_int **)&PTR__CastExpression_02440ce0;
  (this->child).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  LogicalType::LogicalType(&this->cast_type,target);
  this->try_cast = try_cast_p;
  _Var1._M_head_impl =
       (child->
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>).
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (child->super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
  )._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = (ParsedExpression *)0x0;
  _Var2._M_head_impl =
       (this->child).
       super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
       .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl;
  (this->child).
  super_unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>._M_t.
  super___uniq_ptr_impl<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ParsedExpression_*,_std::default_delete<duckdb::ParsedExpression>_>
  .super__Head_base<0UL,_duckdb::ParsedExpression_*,_false>._M_head_impl = _Var1._M_head_impl;
  if (_Var2._M_head_impl != (ParsedExpression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    return;
  }
  return;
}

Assistant:

CastExpression::CastExpression(LogicalType target, unique_ptr<ParsedExpression> child, bool try_cast_p)
    : ParsedExpression(ExpressionType::OPERATOR_CAST, ExpressionClass::CAST), cast_type(std::move(target)),
      try_cast(try_cast_p) {
	D_ASSERT(child);
	this->child = std::move(child);
}